

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O3

void __thiscall choc::text::CodePrinter::~CodePrinter(CodePrinter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->sectionBreakString)._M_dataplus._M_p;
  paVar1 = &(this->sectionBreakString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->newLineString)._M_dataplus._M_p;
  paVar1 = &(this->newLineString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>::
  ~vector(&this->lines);
  return;
}

Assistant:

~CodePrinter() = default;